

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::UnaryAggregateHeap<long,_duckdb::LessThan>::Insert
          (UnaryAggregateHeap<long,_duckdb::LessThan> *this,ArenaAllocator *allocator,long *value)

{
  HeapEntry<long> *pHVar1;
  idx_t iVar2;
  bool bVar3;
  _ValueType __value;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  pHVar1 = this->heap;
  uVar7 = this->size;
  if (uVar7 < this->capacity) {
    this->size = uVar7 + 1;
    pHVar1[uVar7].value = *value;
    lVar4 = pHVar1[uVar7].value;
    if (1 < (long)(uVar7 + 1)) {
      do {
        uVar5 = (long)((uVar7 - ((long)(uVar7 - 1) >> 0x3f)) + -1) >> 1;
        if (lVar4 <= pHVar1[uVar5].value) break;
        pHVar1[uVar7].value = pHVar1[uVar5].value;
        bVar3 = 2 < (long)uVar7;
        uVar7 = uVar5;
      } while (bVar3);
    }
  }
  else {
    if (pHVar1->value <= *value) {
      return;
    }
    if (1 < (long)uVar7) {
      lVar4 = pHVar1[uVar7 - 1].value;
      pHVar1[uVar7 - 1].value = pHVar1->value;
      uVar7 = uVar7 * 8 - 8;
      lVar8 = (long)uVar7 >> 3;
      if (lVar8 < 3) {
        lVar6 = 0;
      }
      else {
        lVar9 = 0;
        do {
          if (pHVar1[lVar9 * 2 + 2].value < pHVar1[lVar9 * 2 + 1].value) {
            lVar6 = lVar9 * 2 + 1;
          }
          else {
            lVar6 = lVar9 * 2 + 2;
          }
          pHVar1[lVar9].value = pHVar1[lVar6].value;
          lVar9 = lVar6;
        } while (lVar6 < (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((uVar7 & 8) == 0) && (lVar6 == lVar8 + -2 >> 1)) {
        pHVar1[lVar6].value = pHVar1[lVar6 * 2 + 1].value;
        lVar6 = lVar6 * 2 + 1;
      }
      if (0 < lVar6) {
        do {
          lVar8 = (lVar6 - (lVar6 + -1 >> 0x3f)) + -1 >> 1;
          if (lVar4 <= pHVar1[lVar8].value) break;
          pHVar1[lVar6].value = pHVar1[lVar8].value;
          bVar3 = 2 < lVar6;
          lVar6 = lVar8;
        } while (bVar3);
      }
      pHVar1[lVar6].value = lVar4;
    }
    iVar2 = this->size;
    lVar4 = *value;
    pHVar1[iVar2 - 1].value = lVar4;
    lVar8 = (long)(iVar2 << 3) >> 3;
    uVar7 = lVar8 - 1;
    if (1 < lVar8) {
      do {
        uVar5 = (long)((uVar7 - ((long)(uVar7 - 1) >> 0x3f)) + -1) >> 1;
        if (lVar4 <= pHVar1[uVar5].value) break;
        pHVar1[uVar7].value = pHVar1[uVar5].value;
        bVar3 = 2 < (long)uVar7;
        uVar7 = uVar5;
      } while (bVar3);
    }
  }
  pHVar1[uVar7].value = lVar4;
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}